

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O3

EventLoop * __thiscall sznet::net::EventLoopThread::startLoop(EventLoopThread *this)

{
  MutexLock *mutex;
  EventLoop *pEVar1;
  void *in_RSI;
  MutexLockGuard lock;
  
  if ((this->m_thread).m_started != true) {
    Thread::start(&this->m_thread);
    mutex = &this->m_mutex;
    sz_mutex_lock(&mutex->m_mutex);
    MutexLock::assignHolder(mutex);
    while (pEVar1 = this->m_loop, pEVar1 == (EventLoop *)0x0) {
      Condition::wait(&this->m_cond,in_RSI);
    }
    (this->m_mutex).m_holder = 0;
    sz_mutex_unlock(&mutex->m_mutex);
    return pEVar1;
  }
  __assert_fail("!m_thread.started()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoopThread.cpp"
                ,0x21,"EventLoop *sznet::net::EventLoopThread::startLoop()");
}

Assistant:

EventLoop* EventLoopThread::startLoop()
{
	assert(!m_thread.started());
	m_thread.start();

	EventLoop* loop = nullptr;
	// 线程创建好了，还是要等等IO事件循环对象的创建
	{
		MutexLockGuard lock(m_mutex);
		while (m_loop == nullptr)
		{
			m_cond.wait();
		}
		loop = m_loop;
	}

	return loop;
}